

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O2

void __thiscall JSON::JSON_number::JSON_number(JSON_number *this,string *value)

{
  (this->super_JSON_value).type_code = vt_number;
  (this->super_JSON_value)._vptr_JSON_value = (_func_int **)&PTR__JSON_number_002aeef8;
  std::__cxx11::string::string((string *)&this->encoded,(string *)value);
  return;
}

Assistant:

JSON_value(value_type_e type_code) :
            type_code(type_code)
        {
        }